

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O0

void dump(char *text,FILE *stream,uchar *ptr,size_t size,char nohex)

{
  uchar uVar1;
  uint local_44;
  ulong uStack_40;
  uint width;
  size_t c;
  size_t i;
  char nohex_local;
  size_t size_local;
  uchar *ptr_local;
  FILE *stream_local;
  char *text_local;
  
  local_44 = 0x10;
  if (nohex != '\0') {
    local_44 = 0x40;
  }
  curl_mfprintf(stream,"%s, %d bytes (0x%x)\n",text,size & 0xffffffff,size & 0xffffffff);
  c = 0;
  do {
    if (size <= c) {
      fflush((FILE *)stream);
      return;
    }
    curl_mfprintf(stream,"%04x: ",c & 0xffffffff);
    if (nohex == '\0') {
      for (uStack_40 = 0; uStack_40 < local_44; uStack_40 = uStack_40 + 1) {
        if (c + uStack_40 < size) {
          curl_mfprintf(stream,"%02x ",ptr[c + uStack_40]);
        }
        else {
          fputs("   ",(FILE *)stream);
        }
      }
    }
    for (uStack_40 = 0; uStack_40 < local_44 && c + uStack_40 < size; uStack_40 = uStack_40 + 1) {
      if ((((nohex != '\0') && (c + uStack_40 + 1 < size)) && (ptr[c + uStack_40] == '\r')) &&
         (ptr[c + uStack_40 + 1] == '\n')) {
        c = ((uStack_40 + 2) - (ulong)local_44) + c;
        break;
      }
      if ((ptr[c + uStack_40] < 0x20) || (0x7f < ptr[c + uStack_40])) {
        uVar1 = '.';
      }
      else {
        uVar1 = ptr[c + uStack_40];
      }
      curl_mfprintf(stream,"%c",uVar1);
      if (((nohex != '\0') && (c + uStack_40 + 2 < size)) &&
         ((ptr[c + uStack_40 + 1] == '\r' && (ptr[c + uStack_40 + 2] == '\n')))) {
        c = ((uStack_40 + 3) - (ulong)local_44) + c;
        break;
      }
    }
    fputc(10,(FILE *)stream);
    c = local_44 + c;
  } while( true );
}

Assistant:

static
void dump(const char *text,
          FILE *stream, unsigned char *ptr, size_t size,
          char nohex)
{
  size_t i;
  size_t c;

  unsigned int width = 0x10;

  if(nohex)
    /* without the hex output, we can fit more on screen */
    width = 0x40;

  fprintf(stream, "%s, %d bytes (0x%x)\n", text, (int)size, (int)size);

  for(i = 0; i<size; i += width) {

    fprintf(stream, "%04x: ", (int)i);

    if(!nohex) {
      /* hex not disabled, show it */
      for(c = 0; c < width; c++)
        if(i + c < size)
          fprintf(stream, "%02x ", ptr[i + c]);
        else
          fputs("   ", stream);
    }

    for(c = 0; (c < width) && (i + c < size); c++) {
      /* check for 0D0A; if found, skip past and start a new line of output */
      if(nohex && (i + c + 1 < size) && ptr[i + c] == 0x0D &&
         ptr[i + c + 1] == 0x0A) {
        i += (c + 2 - width);
        break;
      }
      fprintf(stream, "%c",
              (ptr[i + c] >= 0x20) && (ptr[i + c]<0x80)? ptr[i + c] : '.');
      /* check again for 0D0A, to avoid an extra \n if it's at width */
      if(nohex && (i + c + 2 < size) && ptr[i + c + 1] == 0x0D &&
         ptr[i + c + 2] == 0x0A) {
        i += (c + 3 - width);
        break;
      }
    }
    fputc('\n', stream); /* newline */
  }
  fflush(stream);
}